

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UStringTrieResult __thiscall icu_63::UCharsTrie::firstForCodePoint(UCharsTrie *this,UChar32 cp)

{
  UStringTrieResult UVar1;
  
  if (cp < 0x10000) {
    UVar1 = first(this,cp);
    return UVar1;
  }
  UVar1 = first(this,((uint)cp >> 10) + 0xd7c0 & 0xffff);
  if ((UVar1 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
    return USTRINGTRIE_NO_MATCH;
  }
  UVar1 = next(this,cp & 0x3ffU | 0xdc00);
  return UVar1;
}

Assistant:

UStringTrieResult
UCharsTrie::firstForCodePoint(UChar32 cp) {
    return cp<=0xffff ?
        first(cp) :
        (USTRINGTRIE_HAS_NEXT(first(U16_LEAD(cp))) ?
            next(U16_TRAIL(cp)) :
            USTRINGTRIE_NO_MATCH);
}